

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTportFragments.c
# Opt level: O3

void sbfTport_fragment(sbfTportStream tstream,sbfBuffer buffer,sbfTportHeader hdr,size_t hdrSize)

{
  sbfTport psVar1;
  void *pvVar2;
  ulong uVar3;
  undefined2 *__dest;
  ulong uVar4;
  sbfBuffer_conflict psVar5;
  ulong __n;
  ulong uVar6;
  char cVar7;
  
  psVar1 = tstream->mTport;
  if (hdrSize <= psVar1->mHandlerTable->mPacketSize) {
    pvVar2 = buffer->mData;
    uVar3 = buffer->mSize;
    pthread_mutex_lock((pthread_mutex_t *)&tstream->mSendLock);
    if (uVar3 != 0) {
      cVar7 = '\x01';
      uVar6 = 0;
      do {
        uVar4 = psVar1->mHandlerTable->mPacketSize - hdrSize;
        __n = uVar3 - uVar6;
        if (uVar4 < uVar3 - uVar6) {
          __n = uVar4;
        }
        psVar5 = (*tstream->mTport->mHandlerTable->mGetBuffer)(tstream->mStream,hdrSize + __n);
        __dest = (undefined2 *)psVar5->mData;
        memcpy(__dest,hdr,hdrSize);
        *__dest = (short)__n;
        *(undefined1 *)(__dest + 2) = 1;
        *(char *)(__dest + 1) = cVar7;
        memcpy((void *)((long)__dest + hdrSize),(void *)((long)pvVar2 + uVar6),__n);
        uVar6 = __n + uVar6;
        if (uVar6 == uVar3) {
          *(byte *)(__dest + 2) = *(byte *)(__dest + 2) | 2;
        }
        (*psVar1->mHandlerTable->mSendBuffer)(tstream->mStream,psVar5);
        cVar7 = cVar7 + '\x01';
      } while (uVar6 < uVar3);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&tstream->mSendLock);
    return;
  }
  __assert_fail("tport->mHandlerTable->mPacketSize >= hdrSize",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/blu-corner[P]sbf/src/transport/sbfTportFragments.c"
                ,0x19,"void sbfTport_fragment(sbfTportStream, sbfBuffer, sbfTportHeader, size_t)");
}

Assistant:

void
sbfTport_fragment (sbfTportStream tstream,
                   sbfBuffer buffer,
                   sbfTportHeader hdr,
                   size_t hdrSize)
{
    sbfTport       tport = tstream->mTport;
    void*          data;
    size_t         size;
    size_t         offset;
    uint8_t        fragnum;
    sbfBuffer      fragbuffer;
    size_t         fragsize;
    sbfTportHeader fraghdr;

    SBF_ASSERT (tport->mHandlerTable->mPacketSize >= hdrSize);

    data = sbfBuffer_getData (buffer);
    size = sbfBuffer_getSize (buffer);

    fragnum = 1;

    sbfMutex_lock (&tstream->mSendLock);

    offset = 0;
    while (offset < size)
    {
        fragsize = SBF_MIN (tport->mHandlerTable->mPacketSize - hdrSize,
                            size - offset);
        fragbuffer = sbfTport_getBuffer (tstream, fragsize + hdrSize);

        fraghdr = sbfBuffer_getData (fragbuffer);
        memcpy (fraghdr, hdr, hdrSize);
        fraghdr->mSize = fragsize;
        fraghdr->mFlags = SBF_MESSAGE_FLAG_LAST_IN_PACKET;
        fraghdr->mFragNum = fragnum++;

        memcpy ((char*)fraghdr + hdrSize, (char*)data + offset, fragsize);

        offset += fragsize;
        if (offset == size)
            fraghdr->mFlags |= SBF_MESSAGE_FLAG_LAST_FRAGMENT;

        tport->mHandlerTable->mSendBuffer (tstream->mStream, fragbuffer);
    }

    sbfMutex_unlock (&tstream->mSendLock);
}